

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TapeUEF.cpp
# Opt level: O0

void __thiscall Storage::Tape::UEF::queue_implicit_byte(UEF *this,uint8_t byte)

{
  undefined4 local_18;
  undefined1 local_11;
  int c;
  uint8_t byte_local;
  UEF *this_local;
  
  queue_bit(this,0);
  local_18 = 8;
  local_11 = byte;
  while (local_18 != 0) {
    queue_bit(this,local_11 & 1);
    local_11 = (byte)((int)(uint)local_11 >> 1);
    local_18 = local_18 + -1;
  }
  queue_bit(this,1);
  return;
}

Assistant:

void UEF::queue_implicit_byte(uint8_t byte) {
	queue_bit(0);
	int c = 8;
	while(c--) {
		queue_bit(byte&1);
		byte >>= 1;
	}
	queue_bit(1);
}